

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void bifgfu(bifcxdef *ctx,int argc)

{
  uchar uVar1;
  byte bVar2;
  objnum oVar3;
  runcxdef *ctx_00;
  runsdef *prVar4;
  voccxdef *pvVar5;
  uint uVar6;
  int iVar7;
  vocddef *pvVar8;
  uint uVar9;
  runsdef val;
  runsdef local_48;
  
  ctx_00 = ctx->bifcxrun;
  prVar4 = ctx_00->runcxsp;
  pvVar5 = ctx_00->runcxvoc;
  uVar1 = prVar4[-1].runstyp;
  ctx_00->runcxsp = prVar4 + -1;
  if (uVar1 == '\n') {
    if (prVar4[-1].runstyp != '\n') {
      ctx_00->runcxerr->errcxptr->erraac = 0;
      runsign(ctx_00,0x3f3);
    }
    oVar3 = prVar4[-1].runsv.runsvobj;
    ctx_00->runcxsp = prVar4 + -2;
    local_48.runstyp = prVar4[-2].runstyp;
    local_48._1_7_ = *(undefined7 *)&prVar4[-2].field_0x1;
    local_48.runsv = prVar4[-2].runsv;
    uVar9 = pvVar5->voccxfuc;
    if (uVar9 != 0) {
      pvVar8 = pvVar5->voccxfus;
      do {
        if (pvVar8->vocdfn == oVar3) {
          bVar2 = (pvVar8->vocdarg).runstyp;
          if (bVar2 == local_48.runstyp) {
            uVar6 = datsiz((uint)bVar2,&local_48.runsv);
            iVar7 = bcmp(&local_48.runsv,&(pvVar8->vocdarg).runsv,(ulong)uVar6);
            if (iVar7 == 0) {
LAB_0012575d:
              runpnum(ctx_00,(ulong)pvVar8->vocdtim);
              return;
            }
          }
        }
        pvVar8 = pvVar8 + 1;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
  }
  else {
    if (prVar4[-1].runstyp != '\x02') {
      ctx_00->runcxerr->errcxptr->erraac = 0;
      runsign(ctx_00,0x3f2);
    }
    oVar3 = prVar4[-1].runsv.runsvobj;
    ctx_00->runcxsp = prVar4 + -2;
    if (prVar4[-2].runstyp != '\r') {
      ctx_00->runcxerr->errcxptr->erraac = 0;
      runsign(ctx_00,0x3f4);
    }
    uVar9 = pvVar5->voccxalc;
    if (uVar9 != 0) {
      pvVar8 = pvVar5->voccxalm;
      do {
        if ((pvVar8->vocdfn == oVar3) && (pvVar8->vocdprp == prVar4[-2].runsv.runsvobj))
        goto LAB_0012575d;
        pvVar8 = pvVar8 + 1;
        uVar9 = uVar9 - 1;
      } while (uVar9 != 0);
    }
  }
  runpush(ctx_00,5,&local_48);
  return;
}

Assistant:

void bifgfu(bifcxdef *ctx, int argc)
{
    vocddef  *daem;
    objnum    func;
    runsdef   val;
    runcxdef *rcx = ctx->bifcxrun;
    int       slots;
    prpnum    prop;
    voccxdef *vcx = ctx->bifcxrun->runcxvoc;

    bifcntargs(ctx, 2, argc);
 
    if (runtostyp(rcx) == DAT_FNADDR)
    {
        /* check on a setfuse()-style fuse: get fnaddr, parm */
        func = runpopfn(rcx);
        runpop(rcx, &val);

        for (slots = vcx->voccxfuc, daem = vcx->voccxfus ;
             slots ; ++daem, --slots)
        {
            if (daem->vocdfn == func
                && daem->vocdarg.runstyp == val.runstyp
                && !memcmp(&val.runsv, &daem->vocdarg.runsv,
                           (size_t)datsiz(val.runstyp, &val.runsv)))
                goto ret_num;
        }
    }
    else
    {
        /* check on a notify()-style fuse: get object, &message */
        func = runpopobj(rcx);
        prop = runpopprp(rcx);

        for (slots = vcx->voccxalc, daem = vcx->voccxalm ;
             slots ; ++daem, --slots)
        {
            if (daem->vocdfn == func && daem->vocdprp == prop)
                goto ret_num;
        }
    }
    
    /* didn't find anything - return nil */
    runpush(rcx, DAT_NIL, &val);
    return;
    
ret_num:
    /* return current daem->vocdtim */
    runpnum(rcx, (long)daem->vocdtim);
    return;
}